

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void CNNModelInit(CharCNNClassifier *model)

{
  (model->model_all).inputHeight = 0xf;
  (model->model_all).inputWidthStep = 0xf;
  (model->model_all).C11.outChannels = 10;
  (model->model_all).C11.inChannels = 1;
  (model->model_all).C11.height = 3;
  (model->model_all).C11.widthStep = 3;
  (model->model_all).S12.channels = 10;
  (model->model_all).S12.height = 2;
  (model->model_all).S12.widthStep = 2;
  (model->model_all).S12.poolType = 1;
  (model->model_all).FC1.inputNum = 0x168;
  (model->model_all).FC1.outputNum = 0x28;
  (model->model_all).FC2.inputNum = 0x28;
  (model->model_all).FC2.outputNum = 0x22;
  (model->model_binary_56).inputHeight = 0xf;
  (model->model_binary_56).inputWidthStep = 0xf;
  (model->model_binary_56).C11.outChannels = 10;
  (model->model_binary_56).C11.inChannels = 1;
  (model->model_binary_56).C11.height = 3;
  (model->model_binary_56).C11.widthStep = 3;
  (model->model_binary_56).S12.channels = 10;
  (model->model_binary_56).S12.height = 2;
  (model->model_binary_56).S12.widthStep = 2;
  (model->model_binary_56).S12.poolType = 1;
  (model->model_binary_56).FC1.inputNum = 0x168;
  (model->model_binary_56).FC1.outputNum = 0x28;
  (model->model_binary_56).FC2.inputNum = 0x28;
  (model->model_binary_56).FC2.outputNum = 2;
  (model->model_binary_8B).inputHeight = 0xf;
  (model->model_binary_8B).inputWidthStep = 8;
  (model->model_binary_8B).C11.outChannels = 10;
  (model->model_binary_8B).C11.inChannels = 1;
  (model->model_binary_8B).C11.height = 3;
  (model->model_binary_8B).C11.widthStep = 3;
  (model->model_binary_8B).S12.channels = 10;
  (model->model_binary_8B).S12.height = 2;
  (model->model_binary_8B).S12.widthStep = 2;
  (model->model_binary_8B).S12.poolType = 1;
  (model->model_binary_8B).FC1.inputNum = 0xb4;
  (model->model_binary_8B).FC1.outputNum = 0x28;
  (model->model_binary_8B).FC2.inputNum = 0x28;
  (model->model_binary_8B).FC2.outputNum = 2;
  model->init = '\x01';
  (model->model_binary_0DQ).inputHeight = 0xf;
  (model->model_binary_0DQ).inputWidthStep = 0xf;
  (model->model_binary_0DQ).C11.outChannels = 10;
  (model->model_binary_0DQ).C11.inChannels = 1;
  (model->model_binary_0DQ).C11.height = 3;
  (model->model_binary_0DQ).C11.widthStep = 3;
  (model->model_binary_0DQ).S12.channels = 10;
  (model->model_binary_0DQ).S12.height = 2;
  (model->model_binary_0DQ).S12.widthStep = 2;
  (model->model_binary_0DQ).S12.poolType = 1;
  (model->model_binary_0DQ).FC1.inputNum = 0x168;
  (model->model_binary_0DQ).FC1.outputNum = 0x28;
  (model->model_binary_0DQ).FC2.inputNum = 0x28;
  (model->model_binary_0DQ).FC2.outputNum = 3;
  return;
}

Assistant:

void CNNModelInit(CharCNNClassifier *model) {

    //region 34分类
    //    1's layer - input layer : 15*15
    model->init = 1;
    model->model_all.inputHeight = 15;
    model->model_all.inputWidthStep = 15;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_all.C11.outChannels = 10;
    model->model_all.C11.inChannels = 1;
    model->model_all.C11.height = 3;
    model->model_all.C11.widthStep = 3;

    //region 该部分注释掉 —— 改为单卷积
//    //    2's layer - convolution Layer 2 : 25*1*5*5
//    model->model_all.C21.outChannels = 25;
//    model->model_all.C21.inChannels = 25;
//    model->model_all.C21.height = 5;
//    model->model_all.C21.widthStep = 5;
//
////    2's layer - convolution layer 3 : 25*1*7*7
//    model->model_all.C31.outChannels = 25;
//    model->model_all.C31.inChannels = 25;
//    model->model_all.C31.height = 7;
//    model->model_all.C31.widthStep = 7;
    //endregion

//    3's layer - subsample layer 1 : 10*2*2
    model->model_all.S12.channels = 10;
    model->model_all.S12.height = 2;
    model->model_all.S12.widthStep = 2;
    model->model_all.S12.poolType = MaxPool;

    //region 该部分注释掉 —— 改为单卷积
    //    3's layer - subsample layer 2 : 25*2*2
//    model->model_all.S22.channels = 25;
//    model->model_all.S22.height = 2;
//    model->model_all.S22.widthStep = 2;
//    model->model_all.S22.poolType = MaxPool;

//    3's layer - subsample layer 3 : 25*2*2
//    model->model_all.S32.channels = 2;
//    model->model_all.S32.height = 2;
//    model->model_all.S32.widthStep = 2;
//    model->model_all.S32.poolType = MaxPool;
    //endregion

//    4's layer - full connected layer : 360*40
    model->model_all.FC1.inputNum = 360;
    model->model_all.FC1.outputNum = 40;

//    5's layer - full connected layer : 40*34
    model->model_all.FC2.inputNum = 40;
    model->model_all.FC2.outputNum = 34;
    //endregion



    //region 二分类器 5-6
    //    1's layer - input layer : 15*15
    model->init = 1;
    model->model_binary_56.inputHeight = 15;
    model->model_binary_56.inputWidthStep = 15;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_binary_56.C11.outChannels = 10;
    model->model_binary_56.C11.inChannels = 1;
    model->model_binary_56.C11.height = 3;
    model->model_binary_56.C11.widthStep = 3;

    //    3's layer - subsample layer 1 : 10*2*2
    model->model_binary_56.S12.channels = 10;
    model->model_binary_56.S12.height = 2;
    model->model_binary_56.S12.widthStep = 2;
    model->model_binary_56.S12.poolType = MaxPool;

    //    4's layer - full connected layer : 360*40
    model->model_binary_56.FC1.inputNum = 360;
    model->model_binary_56.FC1.outputNum = 40;

//    5's layer - full connected layer : 40*2
    model->model_binary_56.FC2.inputNum = 40;
    model->model_binary_56.FC2.outputNum = 2;


    //endregion

    //region 二分类器 8-B,局部特征（左半边）
    //    1's layer - input layer : 15*15
    model->init = 1;
    model->model_binary_8B.inputHeight = 15;
    model->model_binary_8B.inputWidthStep = 8;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_binary_8B.C11.outChannels = 10;
    model->model_binary_8B.C11.inChannels = 1;
    model->model_binary_8B.C11.height = 3;
    model->model_binary_8B.C11.widthStep = 3;

    //    3's layer - subsample layer 1 : 10*2*2
    model->model_binary_8B.S12.channels = 10;
    model->model_binary_8B.S12.height = 2;
    model->model_binary_8B.S12.widthStep = 2;
    model->model_binary_8B.S12.poolType = MaxPool;

    //    4's layer - full connected layer : 360*40
    model->model_binary_8B.FC1.inputNum = 180;
    model->model_binary_8B.FC1.outputNum = 40;

//    5's layer - full connected layer : 40*2
    model->model_binary_8B.FC2.inputNum = 40;
    model->model_binary_8B.FC2.outputNum = 2;


    //endregion


    //region 3分类器 0-D-Q
    //    1's layer - input layer : 15*15
    model->init = 1;
    model->model_binary_0DQ.inputHeight = 15;
    model->model_binary_0DQ.inputWidthStep = 15;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_binary_0DQ.C11.outChannels = 10;
    model->model_binary_0DQ.C11.inChannels = 1;
    model->model_binary_0DQ.C11.height = 3;
    model->model_binary_0DQ.C11.widthStep = 3;

    //    3's layer - subsample layer 1 : 10*2*2
    model->model_binary_0DQ.S12.channels = 10;
    model->model_binary_0DQ.S12.height = 2;
    model->model_binary_0DQ.S12.widthStep = 2;
    model->model_binary_0DQ.S12.poolType = MaxPool;

    //    4's layer - full connected layer : 360*40
    model->model_binary_0DQ.FC1.inputNum = 360;
    model->model_binary_0DQ.FC1.outputNum = 40;

//    5's layer - full connected layer : 40*2
    model->model_binary_0DQ.FC2.inputNum = 40;
    model->model_binary_0DQ.FC2.outputNum = 3;


    //endregion
}